

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O3

UNormalizationCheckResult
unorm2_quickCheck_63(UNormalizer2 *norm2,UChar *s,int32_t length,UErrorCode *pErrorCode)

{
  UNormalizationCheckResult UVar1;
  UnicodeString sString;
  ConstChar16Ptr local_70;
  UChar *local_68;
  UnicodeString local_58;
  
  UVar1 = UNORM_NO;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((length < -1) || (s == (UChar *)0x0 && length != 0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      local_70.p_ = s;
      icu_63::UnicodeString::UnicodeString(&local_58,(byte)((uint)length >> 0x1f),&local_70,length);
      local_68 = local_70.p_;
      UVar1 = (**(code **)(*(long *)norm2 + 0x68))(norm2,&local_58,pErrorCode);
      icu_63::UnicodeString::~UnicodeString(&local_58);
    }
  }
  return UVar1;
}

Assistant:

U_CAPI UNormalizationCheckResult U_EXPORT2
unorm2_quickCheck(const UNormalizer2 *norm2,
                  const UChar *s, int32_t length,
                  UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return UNORM_NO;
    }
    if((s==NULL && length!=0) || length<-1) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return UNORM_NO;
    }
    UnicodeString sString(length<0, s, length);
    return ((const Normalizer2 *)norm2)->quickCheck(sString, *pErrorCode);
}